

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_impl.h
# Opt level: O2

uint64_t safe_sub_uint64_int32(uint64_t a,int32_t b)

{
  ulong uVar1;
  
  if (b < 0) {
    uVar1 = (ulong)b;
    if (uVar1 <= a) goto LAB_00149c5a;
  }
  else {
    uVar1 = (ulong)(uint)b;
    if (a < uVar1) {
LAB_00149c5a:
      safe_math_fail("safe_math_fail safe_sub_uint64_int32");
    }
  }
  return a - uVar1;
}

Assistant:

static inline uint64_t safe_sub_uint64_int32(uint64_t a, int32_t b)
{
    // lhs is an uint64_t, rhs signed
    // must first see if rhs is positive or negative
    if (b >= 0)
    {
        if ((uint64_t)b <= a)
        {
            return (uint64_t)(a - (uint64_t)b);
        }
    }
    else
    {
        uint64_t tmp = a;
        // we're now effectively adding
        uint64_t result = a + safe_abs64(b);

        if (result >= tmp)
            return result;
    }

    safe_math_fail("safe_math_fail safe_sub_uint64_int32");
}